

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

uint32_t map_add_int32_val_int32_col
                   (uint32_t n,int32_t *res,int32_t val,int32_t *col2,uint32_t *sel)

{
  uint32_t i;
  ulong uVar1;
  
  if (sel == (uint32_t *)0x0) {
    for (uVar1 = 0; n != uVar1; uVar1 = uVar1 + 1) {
      res[uVar1] = col2[uVar1] + val;
    }
  }
  else {
    for (uVar1 = 0; n != uVar1; uVar1 = uVar1 + 1) {
      res[uVar1] = col2[sel[uVar1]] + val;
    }
  }
  return n;
}

Assistant:

uint32_t map_add_int32_val_int32_col(uint32_t n, int32_t *res, int32_t val, int32_t *col2, uint32_t *sel) {
    if (sel == nullptr) {
        for (uint32_t i = 0; i < n; i++)
            res[i] = val + col2[i];
    }
    else {
        for (uint32_t i = 0; i < n; i++)
            res[i] = val + col2[sel[i]];
    }

    return n;
}